

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockwidget.cpp
# Opt level: O0

void __thiscall QDockWidgetPrivate::endDrag(QDockWidgetPrivate *this,EndDragMode mode)

{
  Data *pDVar1;
  QDockAreaLayout *pQVar2;
  Representation RVar3;
  bool bVar4;
  DockWidgetArea DVar5;
  TabPosition TVar6;
  QWidget *this_00;
  QDockWidgetGroupWindow *this_01;
  QMainWindowLayout *pQVar7;
  QRect *pQVar8;
  QDockAreaLayoutInfo *pQVar9;
  QDockWidgetGroupWindow *pQVar10;
  int in_ESI;
  QMainWindowLayout *in_RDI;
  long in_FS_OFFSET;
  QDockWidgetGroupWindow *groupWindow;
  QDockWidgetGroupWindow *dwgw;
  DockWidgetArea area;
  QDockWidgetLayout *dwLayout;
  QMainWindowLayout *mwLayout;
  QMainWindow *mainWindow;
  QDockWidget *q;
  WindowFlags flags;
  QDockWidget *in_stack_ffffffffffffff88;
  QMainWindowLayout *in_stack_ffffffffffffff90;
  QLayoutItem *in_stack_ffffffffffffff98;
  QFlagsStorage<Qt::WindowType> flags_00;
  undefined8 in_stack_ffffffffffffffa8;
  undefined1 active;
  QDockWidgetPrivate *in_stack_ffffffffffffffb0;
  QMainWindowLayout *dockWidget;
  QFlagsStorage<Qt::WindowType> local_c;
  long local_8;
  
  active = (undefined1)((ulong)in_stack_ffffffffffffffa8 >> 0x38);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = &q_func((QDockWidgetPrivate *)in_RDI)->super_QWidget;
  QWidget::releaseMouse((QWidget *)0x58d21d);
  if (((in_RDI->layoutState).dockAreaLayout.docks[1].separatorWidgets.d.d[1].super_QArrayData.alloc
      & 1) != 0) {
    this_01 = (QDockWidgetGroupWindow *)
              mainwindow_from_dock((QDockWidget *)in_stack_ffffffffffffff98);
    pQVar7 = qt_mainwindow_layout((QMainWindow *)0x58d24c);
    if (pQVar7 == (QMainWindowLayout *)0x0) goto LAB_0058d4e8;
    if ((in_ESI == 1) ||
       (bVar4 = QMainWindowLayout::plug((QMainWindowLayout *)dwgw,(QLayoutItem *)groupWindow),
       !bVar4)) {
      bVar4 = hasFeature((QDockWidgetPrivate *)in_stack_ffffffffffffff90,
                         (DockWidgetFeature)((ulong)in_stack_ffffffffffffff88 >> 0x20));
      if (bVar4) {
        if (((in_RDI->layoutState).dockAreaLayout.docks[1].separatorWidgets.d.d[2].super_QArrayData.
             alloc & 1) != 0) {
          in_stack_ffffffffffffff98 =
               *(QLayoutItem **)
                &(in_RDI->layoutState).dockAreaLayout.docks[1].separatorWidgets.d.d[2].
                 super_QArrayData;
          if (in_stack_ffffffffffffff98 != (QLayoutItem *)0x0) {
            (*in_stack_ffffffffffffff98->_vptr_QLayoutItem[1])();
          }
          pDVar1 = (in_RDI->layoutState).dockAreaLayout.docks[1].separatorWidgets.d.d;
          pDVar1[2].super_QArrayData.ref_ = (Type)0x0;
          pDVar1[2].super_QArrayData.flags = (QFlagsStorageHelper<QArrayData::ArrayOption,_4>)0x0;
        }
        flags_00.i = (Int)((ulong)in_stack_ffffffffffffff98 >> 0x20);
        QMainWindowLayout::restore
                  (in_stack_ffffffffffffff90,SUB81((ulong)in_stack_ffffffffffffff88 >> 0x38,0));
        qobject_cast<QDockWidgetLayout*>((QObject *)0x58d308);
        bVar4 = QDockWidgetLayout::nativeWindowDeco((QDockWidgetLayout *)in_RDI);
        if (bVar4) {
          setResizerActive(in_stack_ffffffffffffffb0,(bool)active);
        }
        else {
          local_c.i = 0xaaaaaaaa;
          local_c.i = (Int)QWidget::windowFlags((QWidget *)in_stack_ffffffffffffff90);
          QFlags<Qt::WindowType>::operator&=((QFlags<Qt::WindowType> *)&local_c,0xfffffbff);
          QWidget::setWindowFlags((QWidget *)in_stack_ffffffffffffff90,(WindowFlags)flags_00.i);
          QDockWidget::isFloating((QDockWidget *)0x58d362);
          setResizerActive(in_stack_ffffffffffffffb0,(bool)active);
          QWidget::show((QWidget *)in_RDI);
        }
        bVar4 = QDockWidget::isFloating((QDockWidget *)0x58d394);
        if (bVar4) {
          pQVar8 = QWidget::geometry(this_00);
          RVar3.m_i = (pQVar8->y1).m_i;
          pQVar2 = &(in_RDI->layoutState).dockAreaLayout;
          pQVar2->docks[1].rect.x2 = (Representation)(pQVar8->x1).m_i;
          pQVar2->docks[1].rect.y2 = (Representation)RVar3.m_i;
          (in_RDI->layoutState).dockAreaLayout.docks[1].mainWindow = *(QMainWindow **)&pQVar8->x2;
          DVar5 = QMainWindow::dockWidgetArea
                            ((QMainWindow *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
          if (DVar5 == NoDockWidgetArea) {
            QObject::parent((QObject *)0x58d405);
            pQVar10 = qobject_cast<QDockWidgetGroupWindow*>((QObject *)0x58d40d);
            dockWidget = pQVar7;
            if (pQVar10 != (QDockWidgetGroupWindow *)0x0) {
              pQVar9 = QDockWidgetGroupWindow::layoutInfo((QDockWidgetGroupWindow *)0x58d42e);
              toDockWidgetArea(pQVar9->dockPos);
              TVar6 = QMainWindowLayout::tabPosition(in_RDI,flags_00.i);
              *(TabPosition *)((long)&(in_RDI->layoutState).dockAreaLayout.docks[1].sep + 4) = TVar6
              ;
              in_stack_ffffffffffffff90 = pQVar7;
            }
          }
          else {
            TVar6 = QMainWindowLayout::tabPosition(in_RDI,flags_00.i);
            *(TabPosition *)((long)&(in_RDI->layoutState).dockAreaLayout.docks[1].sep + 4) = TVar6;
            dockWidget = pQVar7;
          }
          if (in_ESI == 0) {
            QWidget::parentWidget((QWidget *)0x58d462);
            pQVar10 = qobject_cast<QDockWidgetGroupWindow*>((QObject *)0x58d46a);
            if (pQVar10 != (QDockWidgetGroupWindow *)0x0) {
              QDockWidgetGroupWindow::reparentToMainWindow(this_01,(QDockWidget *)dockWidget);
            }
          }
        }
        QWidget::activateWindow((QWidget *)in_stack_ffffffffffffff90);
      }
      else {
        QMainWindowLayout::revert(in_RDI,in_stack_ffffffffffffff98);
      }
    }
  }
  pDVar1 = (in_RDI->layoutState).dockAreaLayout.docks[1].separatorWidgets.d.d;
  if (pDVar1 != (Data *)0x0) {
    operator_delete(pDVar1,0x30);
  }
  (in_RDI->layoutState).dockAreaLayout.docks[1].separatorWidgets.d.d = (Data *)0x0;
LAB_0058d4e8:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QDockWidgetPrivate::endDrag(EndDragMode mode)
{
    Q_Q(QDockWidget);
    Q_ASSERT(state != nullptr);

    q->releaseMouse();

    if (state->dragging) {
        const QMainWindow *mainWindow = mainwindow_from_dock(q);
        Q_ASSERT(mainWindow != nullptr);
        QMainWindowLayout *mwLayout = qt_mainwindow_layout(mainWindow);

        // if mainWindow is being deleted in an ongoing drag, make it a no-op instead of crashing
        if (!mwLayout)
            return;

        if (mode == EndDragMode::Abort || !mwLayout->plug(state->widgetItem)) {
            if (hasFeature(this, QDockWidget::DockWidgetFloatable)) {
                // This QDockWidget will now stay in the floating state.
                if (state->ownWidgetItem) {
                    delete state->widgetItem;
                    state->widgetItem = nullptr;
                }
                mwLayout->restore();
                QDockWidgetLayout *dwLayout = qobject_cast<QDockWidgetLayout*>(layout);
                if (!dwLayout->nativeWindowDeco()) {
                    // get rid of the X11BypassWindowManager window flag and activate the resizer
                    Qt::WindowFlags flags = q->windowFlags();
                    flags &= ~Qt::X11BypassWindowManagerHint;
                    q->setWindowFlags(flags);
                    setResizerActive(q->isFloating());
                    q->show();
                } else {
                    setResizerActive(false);
                }
                if (q->isFloating()) { // Might not be floating when dragging a QDockWidgetGroupWindow
                    undockedGeometry = q->geometry();
#if QT_CONFIG(tabwidget)
                    // is the widget located within the mainwindow?
                    const Qt::DockWidgetArea area = mainWindow->dockWidgetArea(q);
                    if (area != Qt::NoDockWidgetArea) {
                        tabPosition = mwLayout->tabPosition(area);
                    } else if (auto dwgw = qobject_cast<QDockWidgetGroupWindow *>(q->parent())) {
                        // DockWidget wasn't found in one of the docks within mainwindow
                        // => derive tabPosition from parent
                        tabPosition = mwLayout->tabPosition(toDockWidgetArea(dwgw->layoutInfo()->dockPos));
                    }
#endif
                    // Reparent, if the drag was out of a dock widget group window
                    if (mode == EndDragMode::LocationChange) {
                        if (auto *groupWindow = qobject_cast<QDockWidgetGroupWindow *>(q->parentWidget()))
                            groupWindow->reparentToMainWindow(q);
                    }
                }
                q->activateWindow();
            } else {
                // The tab was not plugged back in the QMainWindow but the QDockWidget cannot
                // stay floating, revert to the previous state.
                mwLayout->revert(state->widgetItem);
            }
        }
    }
    delete state;
    state = nullptr;
}